

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilerBuffer.cpp
# Opt level: O1

void __thiscall helics::ProfilerBuffer::writeFile(ProfilerBuffer *this)

{
  long lVar1;
  pointer pbVar2;
  ostream *poVar3;
  char *pcVar4;
  int *piVar5;
  error_code *peVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *m;
  pointer pbVar7;
  ofstream file;
  undefined1 auStack_248 [8];
  undefined4 local_240;
  undefined8 local_238;
  long local_230;
  filebuf local_228 [20];
  byte abStack_214 [4];
  uint auStack_210 [54];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(int)this + (_S_out|_S_in));
  lVar1 = *(long *)(local_230 + -0x18);
  if ((*(uint *)((long)auStack_210 + lVar1) & 5) == 0) {
    abStack_214[lVar1] = abStack_214[lVar1] | 5;
    std::ios::clear((int)auStack_248 + (int)lVar1 + 0x18);
    pbVar7 = (this->mBuffers).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->mBuffers).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar7 != pbVar2) {
      do {
        if (pbVar7->_M_string_length != 0) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,(pbVar7->_M_dataplus)._M_p,
                              pbVar7->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
        pbVar7->_M_string_length = 0;
        *(pbVar7->_M_dataplus)._M_p = '\0';
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != pbVar2);
    }
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->mBuffers,
                      (this->mBuffers).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _pthread_mutex_unlock;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  pcVar4 = (char *)__cxa_allocate_exception(0x20);
  piVar5 = __errno_location();
  peVar6 = (error_code *)strerror(*piVar5);
  local_238 = std::iostream_category();
  local_240 = 1;
  std::ios_base::failure[abi:cxx11]::failure(pcVar4,peVar6);
  __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

void ProfilerBuffer::writeFile()
{
    std::ofstream file;
    // can't enable exception now because of gcc bug that raises ios_base::failure with useless
    // message file.exceptions(file.exceptions() | std::ios::failbit);
    file.open(mFileName, std::ios::out | std::ios::app);
    if (file.fail()) {
        throw std::ios_base::failure(std::strerror(errno));
    }

    // make sure write fails with exception if something is wrong
    file.exceptions(file.exceptions() | std::ios::failbit | std::ifstream::badbit);

    for (auto& m : mBuffers) {
        if (!m.empty()) {
            file << m << std::endl;
        }
        m.clear();
    }
    mBuffers.clear();
}